

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdDecompose_rec
               (Kit_DsdNtk_t *pNtk,Kit_DsdObj_t *pObj,uint uSupp,unsigned_short *pPar,int nDecMux)

{
  Kit_DsdObj_t *pPar_00;
  undefined1 *puVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  undefined2 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint iVar;
  int iVar14;
  uint *pOut;
  uint *pOut_00;
  uint *puVar15;
  Kit_DsdObj_t *pKVar16;
  Kit_DsdObj_t *pKVar17;
  byte bVar18;
  ulong uVar19;
  undefined4 *puVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  unsigned_short uVar24;
  uint *pTruth;
  undefined2 uVar25;
  Kit_DsdObj_t KVar26;
  ulong uVar27;
  uint *pOut_01;
  uint *puVar28;
  int iVar29;
  uint uVar30;
  uint *puVar31;
  uint local_dc;
  
  do {
    pPar_00 = pObj + 1;
    local_dc = uSupp;
LAB_0047f5f2:
    KVar26 = *pObj;
    bVar18 = (KVar26._3_1_ >> 2) - 5;
    iVar14 = 5 << (bVar18 & 0x1f);
    if ((uint)KVar26 < 0x18000000) {
      iVar14 = 5;
    }
    iVar13 = 3 << (bVar18 & 0x1f);
    if ((uint)KVar26 < 0x18000000) {
      iVar13 = 3;
    }
    iVar29 = 1 << (bVar18 & 0x1f);
    if ((uint)KVar26 < 0x18000000) {
      iVar29 = 1;
    }
    puVar15 = (uint *)((long)&pPar_00->field_0x0 + (ulong)((uint)KVar26 >> 8 & 0x3fc));
    pTruth = (uint *)0x0;
    if (((uint)KVar26 & 0x1c0) == 0x140) {
      pTruth = puVar15;
    }
    if ((uint)KVar26 < 0x4000000) {
      __assert_fail("pObj->nFans > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7be,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    if (((uint)KVar26 & 0x1c0) != 0x140) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7bf,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    puVar31 = pNtk->pMem;
    uVar6 = Kit_TruthSupport(puVar15,(uint)KVar26 >> 0x1a);
    if (uVar6 != local_dc) {
      __assert_fail("uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7c0,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    uVar6 = Kit_BitMask((uint)*pObj >> 0x1a);
    if (uVar6 != local_dc) {
      uVar6 = Kit_WordCountOnes(local_dc);
      Kit_TruthShrink(pNtk->pMem,puVar15,uVar6,(uint)*pObj >> 0x1a,local_dc,1);
      KVar26 = *pObj;
      uVar23 = 0;
      for (uVar21 = 0; uVar21 < (uint)KVar26 >> 0x1a; uVar21 = uVar21 + 1) {
        uVar27 = uVar23;
        if ((local_dc >> ((uint)uVar21 & 0x1f) & 1) != 0) {
          uVar27 = (ulong)((uint)uVar23 + 1);
          *(undefined2 *)((long)&pObj[1].field_0x0 + uVar23 * 2) =
               *(undefined2 *)((long)&pObj[1].field_0x0 + uVar21 * 2);
        }
        uVar23 = uVar27;
      }
      if ((uint)uVar23 != uVar6) {
        __assert_fail("k == nFansNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x7ca,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pObj = (Kit_DsdObj_t)((uint)KVar26 & 0x3ffffff | uVar6 << 0x1a);
      local_dc = Kit_BitMask(uVar6 & 0x3f);
    }
    KVar26 = *pObj;
    uVar6 = (uint)KVar26 >> 0x1a;
    if (uVar6 == 1) {
      *pObj = (Kit_DsdObj_t)((uint)KVar26 & 0x7fffe3f);
      if (*pTruth == 0x55555555) {
        iVar14 = Abc_LitNot((uint)*(ushort *)pPar_00);
        uVar24 = (unsigned_short)iVar14;
        *(unsigned_short *)pPar_00 = uVar24;
      }
      else {
        if (*pTruth != 0xaaaaaaaa) {
          __assert_fail("pTruth[0] == 0xAAAAAAAA",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x7d6,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        uVar24 = *(unsigned_short *)pPar_00;
      }
      iVar14 = Abc_LitIsCompl((uint)*pPar);
      *pPar = uVar24 ^ (ushort)iVar14;
      return;
    }
    puVar15 = puVar31 + iVar29;
    uVar30 = uVar6;
    if (((uint)KVar26 >> 9 & 1) == 0) {
      do {
        KVar26 = *pObj;
        uVar6 = (uint)KVar26 >> 0x1a;
        if ((int)uVar30 < 1) goto LAB_0047f8d8;
        uVar30 = uVar30 - 1;
        Kit_TruthCofactor0New(puVar31,pTruth,uVar6,uVar30);
        Kit_TruthCofactor1New(puVar15,pTruth,(uint)*pObj >> 0x1a,uVar30);
        KVar26 = *pObj;
        uVar6 = (uint)KVar26 >> 0x1a;
        iVar7 = Kit_TruthIsConst0(puVar31,uVar6);
        iVar8 = Kit_TruthIsConst0(puVar15,uVar6);
        iVar9 = Kit_TruthIsConst1(puVar31,uVar6);
        iVar10 = Kit_TruthIsConst1(puVar15,uVar6);
        uVar23 = (ulong)(uint)(1 << ((KVar26._3_1_ >> 2) - 5 & 0x1f));
        if ((uint)KVar26 < 0x18000000) {
          uVar23 = 1;
        }
        do {
          iVar22 = (int)uVar23;
          if (iVar22 < 1) {
            bVar2 = true;
            goto LAB_0047f844;
          }
          lVar3 = uVar23 - 1;
          lVar4 = uVar23 - 1;
          uVar23 = uVar23 - 1;
        } while ((puVar31[iVar29 + lVar3] ^ puVar31[lVar4]) == 0xffffffff);
        bVar2 = false;
LAB_0047f844:
        iVar11 = Kit_TruthIsEqual(puVar31,puVar15,uVar6);
        if (iVar11 != 0) {
          __assert_fail("!Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x7eb,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        uVar23 = (ulong)uVar30;
        if (bVar2 || iVar9 + iVar10 + iVar8 + iVar7 != 0) {
          pKVar16 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
          *pKVar16 = (Kit_DsdObj_t)
                     (((uint)*pKVar16 & 0x3ffff) + ((int)*pKVar16 + 0x40000U & 0x3fc0000) +
                     0x8000000);
          *(undefined2 *)(pKVar16 + 1) = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar23 * 2);
          *(undefined2 *)((long)&pObj[1].field_0x0 + uVar23 * 2) = 0x7f;
          puVar1 = &pKVar16[1].field_0x2;
          *(ushort *)&pKVar16[1].field_0x2 = SUB42(*pObj,0) * 2 & 0x7e;
          KVar26 = *pKVar16;
          iVar14 = Abc_LitIsCompl((uint)*pPar);
          iVar14 = iVar14 + ((uint)KVar26 & 0x3f) * 2;
          *pPar = (ushort)iVar14;
          if (iVar7 == 0) {
            if (iVar8 == 0) {
              if (iVar9 == 0) {
                if (iVar10 == 0) {
                  if (0 < iVar22) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                                  ,0x830,
                                  "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                                 );
                  }
                  *pKVar16 = (Kit_DsdObj_t)((uint)*pKVar16 & 0xfffffe3f | 0x100);
                }
                else {
                  iVar14 = Abc_LitNot(iVar14);
                  *pPar = (ushort)iVar14;
                  iVar14 = Abc_LitNot((uint)*(ushort *)(pKVar16 + 1));
                  *(short *)(pKVar16 + 1) = (short)iVar14;
                  iVar14 = Abc_LitNot((uint)*(ushort *)&pKVar16[1].field_0x2);
                  *(short *)&pKVar16[1].field_0x2 = (short)iVar14;
                }
                uVar6 = (uint)*pObj >> 0x1a;
              }
              else {
                iVar14 = Abc_LitNot(iVar14);
                *pPar = (ushort)iVar14;
                iVar14 = Abc_LitNot((uint)*(ushort *)puVar1);
                *(short *)puVar1 = (short)iVar14;
                uVar6 = (uint)*pObj >> 0x1a;
                puVar31 = puVar15;
              }
            }
            else {
              iVar14 = Abc_LitNot((uint)*(ushort *)(pKVar16 + 1));
              *(short *)(pKVar16 + 1) = (short)iVar14;
              uVar6 = (uint)*pObj >> 0x1a;
            }
            Kit_TruthCopy(pTruth,puVar31,uVar6);
          }
          else {
            Kit_TruthCopy(pTruth,puVar15,(uint)*pObj >> 0x1a);
          }
          local_dc = local_dc & ~(1 << (uVar30 & 0x1f));
          puVar15 = (uint *)((long)&pPar_00->field_0x0 + (ulong)((uint)*pObj >> 8 & 0x3fc));
          if (((uint)*pObj & 0x1c0) != 0x140) {
            puVar15 = (uint *)0x0;
          }
          pPar = (unsigned_short *)puVar1;
          if (puVar15 != pTruth) {
            __assert_fail("Kit_DsdObjTruth(pObj) == pTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x832,
                          "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                         );
          }
          goto LAB_0047f5f2;
        }
        uVar6 = Kit_TruthSupport(puVar31,uVar6);
        uSupp = Kit_TruthSupport(puVar15,(uint)*pObj >> 0x1a);
        if (local_dc != (uVar6 | 1 << (uVar30 & 0x1f) | uSupp)) {
          __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x7f1,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
      } while ((uSupp & uVar6) != 0);
      pKVar16 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      pKVar17 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      for (uVar21 = 0; uVar21 < (uint)*pObj >> 0x1a; uVar21 = uVar21 + 1) {
        uVar5 = 0x7f;
        uVar25 = 0x7f;
        if ((uVar6 >> ((uint)uVar21 & 0x1f) & 1) != 0) {
          uVar25 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar21 * 2);
        }
        *(undefined2 *)(&pKVar16[1].field_0x0 + uVar21 * 2) = uVar25;
        if ((1 << ((byte)uVar21 & 0x1f) & uSupp) != 0) {
          uVar5 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar21 * 2);
        }
        *(undefined2 *)(&pKVar17[1].field_0x0 + uVar21 * 2) = uVar5;
      }
      puVar28 = (uint *)(&pKVar16[1].field_0x0 + ((uint)*pKVar16 >> 8 & 0x3fc));
      if (((uint)*pKVar16 & 0x1c0) != 0x140) {
        puVar28 = (uint *)0x0;
      }
      Kit_TruthCopy(puVar28,puVar31,(uint)*pObj >> 0x1a);
      puVar31 = (uint *)(&pKVar17[1].field_0x0 + ((uint)*pKVar17 >> 8 & 0x3fc));
      if (((uint)*pKVar17 & 0x1c0) != 0x140) {
        puVar31 = (uint *)0x0;
      }
      Kit_TruthCopy(puVar31,puVar15,(uint)*pObj >> 0x1a);
      KVar26 = *pObj;
      if (((uint)KVar26 & 0x1c0) != 0x140) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x7ff,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pTruth = 0xcacacaca;
      *pObj = (Kit_DsdObj_t)((uint)KVar26 & 0x3ffff7f | 0xc000000);
      *(undefined2 *)(pObj + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar23 * 2);
      *(ushort *)(pObj + 1) = SUB42(*pKVar16,0) * 2 & 0x7e;
      *pKVar16 = (Kit_DsdObj_t)((uint)*pKVar16 & 0xfc03ffff | (int)*pKVar16 + 0x40000U & 0x3fc0000);
      *(ushort *)&pObj[1].field_0x2 = SUB42(*pKVar17,0) * 2 & 0x7e;
      pPar = (unsigned_short *)&pObj[1].field_0x2;
      *pKVar17 = (Kit_DsdObj_t)((uint)*pKVar17 & 0xfc03ffff | (int)*pKVar17 + 0x40000U & 0x3fc0000);
      Kit_DsdDecompose_rec(pNtk,pKVar16,uVar6,(unsigned_short *)pPar_00,nDecMux);
      pObj = pKVar17;
    }
    else {
LAB_0047f8d8:
      pOut_01 = puVar31 + iVar29 * 2;
      pOut = puVar31 + iVar13;
      puVar28 = puVar31 + (iVar29 << 2);
      pOut_00 = puVar31 + iVar14;
      KVar26 = (Kit_DsdObj_t)((uint)KVar26 | 0x200);
      *pObj = KVar26;
      uVar23 = (ulong)uVar6;
      while (0 < (int)uVar23) {
        uVar21 = uVar23 - 1;
        uVar6 = (uint)uVar21;
        iVar14 = Kit_TruthVarInSupport(pTruth,(uint)KVar26 >> 0x1a,uVar6);
        if (iVar14 == 0) {
          __assert_fail("Kit_TruthVarInSupport( pTruth, pObj->nFans, i )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x83b,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        Kit_TruthCofactor0New(puVar31,pTruth,(uint)*pObj >> 0x1a,uVar6);
        Kit_TruthCofactor1New(puVar15,pTruth,(uint)*pObj >> 0x1a,uVar6);
        uVar30 = Kit_TruthSupport(puVar31,(uint)*pObj >> 0x1a);
        uVar12 = Kit_TruthSupport(puVar15,(uint)*pObj >> 0x1a);
        if (local_dc != (uVar30 | 1 << (uVar6 & 0x1f) | uVar12)) {
          __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x842,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        if ((uVar30 == 0) || (uVar12 == 0)) {
          pObj->field_0x1 = pObj->field_0x1 & 0xfd;
          goto LAB_0047f5f2;
        }
        iVar14 = Kit_WordCountOnes(~uVar12 & uVar30);
        iVar13 = Kit_WordCountOnes(~uVar30 & uVar12);
        uVar19 = uVar21 & 0xffffffff;
        uVar27 = uVar23;
        if ((iVar14 == 1) && (iVar13 == 1)) {
          iVar = Kit_WordFindFirstBit(~uVar12 & uVar30);
          iVar14 = Kit_WordFindFirstBit(~uVar30 & uVar12);
          Kit_TruthCofactor0New(pOut_01,puVar31,(uint)*pObj >> 0x1a,iVar);
          Kit_TruthCofactor1New(pOut,puVar31,(uint)*pObj >> 0x1a,iVar);
          Kit_TruthCofactor0New(puVar28,puVar15,(uint)*pObj >> 0x1a,iVar14);
          Kit_TruthCofactor1New(pOut_00,puVar15,(uint)*pObj >> 0x1a,iVar14);
          KVar26 = *pObj;
          uVar30 = (uint)KVar26 >> 0x1a;
          iVar13 = Kit_TruthIsEqual(pOut_01,puVar28,uVar30);
          iVar29 = Kit_TruthIsEqual(pOut,pOut_00,uVar30);
          iVar7 = Kit_TruthIsEqual(pOut_01,pOut_00,uVar30);
          iVar8 = Kit_TruthIsEqual(pOut,puVar28,uVar30);
          if (((iVar13 != 0) && (iVar29 != 0)) || ((iVar7 != 0 && (iVar8 != 0)))) goto LAB_0047fe42;
        }
        else {
          KVar26 = *pObj;
        }
        while( true ) {
          uVar6 = (uint)uVar27;
          uVar23 = uVar21;
          if ((uint)KVar26 >> 0x1a <= uVar6) break;
          Kit_TruthCofactor0New(pOut_01,puVar31,(uint)KVar26 >> 0x1a,uVar6);
          Kit_TruthCofactor1New(pOut,puVar31,(uint)*pObj >> 0x1a,uVar6);
          Kit_TruthCofactor0New(puVar28,puVar15,(uint)*pObj >> 0x1a,uVar6);
          Kit_TruthCofactor1New(pOut_00,puVar15,(uint)*pObj >> 0x1a,uVar6);
          KVar26 = *pObj;
          uVar30 = (uint)KVar26 >> 0x1a;
          iVar14 = Kit_TruthIsEqual(pOut_01,pOut,uVar30);
          iVar13 = Kit_TruthIsEqual(pOut_01,puVar28,uVar30);
          iVar29 = Kit_TruthIsEqual(pOut_01,pOut_00,uVar30);
          iVar7 = Kit_TruthIsEqual(pOut,puVar28,uVar30);
          iVar8 = Kit_TruthIsEqual(pOut,pOut_00,uVar30);
          iVar9 = Kit_TruthIsEqual(puVar28,pOut_00,uVar30);
          if (0xfffffffd < (iVar9 + iVar7 + iVar29 + iVar14 + iVar13 + iVar8) - 4U) {
            pKVar16 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
            KVar26 = *pKVar16;
            *pKVar16 = (Kit_DsdObj_t)
                       (((int)KVar26 + 0x40000U & 0x3fc0000) + ((uint)KVar26 & 0x3ffff) + 0x8000000)
            ;
            *(undefined2 *)(pKVar16 + 1) = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar27 * 2);
            *(ushort *)((long)&pObj[1].field_0x0 + uVar27 * 2) = KVar26._0_2_ * 2 & 0x7e;
            *(undefined2 *)&pKVar16[1].field_0x2 =
                 *(undefined2 *)((long)&pObj[1].field_0x0 + uVar19 * 2);
            *(undefined2 *)((long)&pObj[1].field_0x0 + uVar19 * 2) = 0x7f;
            local_dc = local_dc & ~(1 << ((byte)uVar21 & 0x1f));
            if (((iVar14 == 0) && (iVar13 == 0)) && (iVar29 == 0)) {
              iVar14 = Abc_LitNot((uint)*(ushort *)(pKVar16 + 1));
              *(short *)(pKVar16 + 1) = (short)iVar14;
              iVar14 = Abc_LitNot((uint)*(ushort *)&pKVar16[1].field_0x2);
              *(short *)&pKVar16[1].field_0x2 = (short)iVar14;
              uVar30 = (uint)*pObj >> 0x1a;
              puVar28 = pOut_01;
              pOut_01 = pOut_00;
            }
            else if (((iVar14 == 0) && (iVar7 == 0)) && (iVar8 == 0)) {
              iVar14 = Abc_LitNot((uint)*(ushort *)&pKVar16[1].field_0x2);
              *(short *)&pKVar16[1].field_0x2 = (short)iVar14;
              KVar26 = *pObj;
LAB_0047fd95:
              uVar30 = (uint)KVar26 >> 0x1a;
              puVar28 = pOut;
            }
            else if (iVar13 == 0 && (iVar9 == 0 && iVar7 == 0)) {
              iVar14 = Abc_LitNot((uint)*(ushort *)(pKVar16 + 1));
              *(short *)(pKVar16 + 1) = (short)iVar14;
              uVar30 = (uint)*pObj >> 0x1a;
            }
            else {
              if ((iVar9 != 0 || iVar8 != 0) || iVar29 != 0) {
                if ((iVar29 == 0) || (iVar7 == 0)) {
                  __assert_fail("fPairs[0][3] && fPairs[1][2]",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                                ,0x8ab,
                                "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                               );
                }
                *pKVar16 = (Kit_DsdObj_t)((uint)*pKVar16 & 0xfffffe3f | 0x100);
                KVar26 = *pObj;
                goto LAB_0047fd95;
              }
              uVar30 = (uint)*pObj >> 0x1a;
              puVar28 = pOut_00;
            }
            Kit_TruthMuxVar(pTruth,pOut_01,puVar28,uVar30,uVar6);
            goto LAB_0047f5f2;
          }
          uVar27 = uVar27 + 1;
        }
      }
      if (nDecMux < 1) {
        return;
      }
      if ((uint)KVar26 >> 0x1a <= (uint)nDecMux) {
        return;
      }
      iVar14 = Kit_TruthBestCofVar(pTruth,(uint)KVar26 >> 0x1a,puVar31,puVar15);
      uVar6 = Kit_TruthSupport(puVar31,(uint)*pObj >> 0x1a);
      uSupp = Kit_TruthSupport(puVar15,(uint)*pObj >> 0x1a);
      pKVar16 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      pKVar17 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      for (uVar23 = 0; uVar23 < (uint)*pObj >> 0x1a; uVar23 = uVar23 + 1) {
        uVar25 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar23 * 2);
        *(undefined2 *)(&pKVar17[1].field_0x0 + uVar23 * 2) = uVar25;
        *(undefined2 *)(&pKVar16[1].field_0x0 + uVar23 * 2) = uVar25;
      }
      puVar28 = (uint *)(&pKVar16[1].field_0x0 + ((uint)*pKVar16 >> 8 & 0x3fc));
      if (((uint)*pKVar16 & 0x1c0) != 0x140) {
        puVar28 = (uint *)0x0;
      }
      Kit_TruthCopy(puVar28,puVar31,(uint)*pObj >> 0x1a);
      puVar31 = (uint *)(&pKVar17[1].field_0x0 + ((uint)*pKVar17 >> 8 & 0x3fc));
      if (((uint)*pKVar17 & 0x1c0) != 0x140) {
        puVar31 = (uint *)0x0;
      }
      Kit_TruthCopy(puVar31,puVar15,(uint)*pObj >> 0x1a);
      KVar26 = *pObj;
      if (((uint)KVar26 & 0x1c0) != 0x140) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x8c3,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pTruth = 0xcacacaca;
      *pObj = (Kit_DsdObj_t)((uint)KVar26 & 0x3ffff7f | 0xc000000);
      *(undefined2 *)(pObj + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + (long)iVar14 * 2);
      *(ushort *)(pObj + 1) = SUB42(*pKVar16,0) * 2 & 0x7e;
      *pKVar16 = (Kit_DsdObj_t)((uint)*pKVar16 & 0xfc03ffff | (int)*pKVar16 + 0x40000U & 0x3fc0000);
      *(ushort *)&pObj[1].field_0x2 = SUB42(*pKVar17,0) * 2 & 0x7e;
      pPar = (unsigned_short *)&pObj[1].field_0x2;
      *pKVar17 = (Kit_DsdObj_t)((uint)*pKVar17 & 0xfc03ffff | (int)*pKVar17 + 0x40000U & 0x3fc0000);
      Kit_DsdDecompose_rec(pNtk,pKVar16,uVar6,(unsigned_short *)pPar_00,nDecMux);
      pObj = pKVar17;
    }
  } while( true );
LAB_0047fe42:
  pKVar16 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,3);
  KVar26 = *pKVar16;
  puVar20 = (undefined4 *)(&pKVar16[1].field_0x0 + ((uint)KVar26 >> 8 & 0x3fc));
  if (((uint)KVar26 & 0x1c0) != 0x140) {
    puVar20 = (undefined4 *)0x0;
  }
  *puVar20 = 0xcacacaca;
  *pKVar16 = (Kit_DsdObj_t)
             (((uint)KVar26 & 0x3ffff) + ((int)KVar26 + 0x40000U & 0x3fc0000) + 0xc000000);
  *(undefined2 *)(pKVar16 + 1) = *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)iVar * 2);
  *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)iVar * 2) = 0x7f;
  *(undefined2 *)&pKVar16[1].field_0x2 =
       *(undefined2 *)((long)&pObj[1].field_0x0 + (long)iVar14 * 2);
  *(undefined2 *)((long)&pObj[1].field_0x0 + (long)iVar14 * 2) = 0x7f;
  local_dc = local_dc & ~(1 << ((byte)iVar14 & 0x1f) | 1 << (iVar & 0x1f));
  *(undefined2 *)(pKVar16 + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar19 * 2);
  *(ushort *)((long)&pObj[1].field_0x0 + uVar19 * 2) = SUB42(*pKVar16,0) * 2 & 0x7e;
  Kit_TruthMuxVar(pTruth,puVar28,pOut_00,(uint)*pObj >> 0x1a,uVar6);
  if ((iVar7 != 0) && (iVar8 != 0)) {
    iVar14 = Abc_LitNot((uint)*(ushort *)(pKVar16 + 1));
    *(ushort *)(pKVar16 + 1) = (ushort)iVar14;
  }
  goto LAB_0047f5f2;
}

Assistant:

void Kit_DsdDecompose_rec( Kit_DsdNtk_t * pNtk, Kit_DsdObj_t * pObj, unsigned uSupp, unsigned short * pPar, int nDecMux )
{
    Kit_DsdObj_t * pRes, * pRes0, * pRes1;
    int nWords = Kit_TruthWordNum(pObj->nFans);
    unsigned * pTruth = Kit_DsdObjTruth(pObj);
    unsigned * pCofs2[2] = { pNtk->pMem, pNtk->pMem + nWords };
    unsigned * pCofs4[2][2] = { {pNtk->pMem + 2 * nWords, pNtk->pMem + 3 * nWords}, {pNtk->pMem + 4 * nWords, pNtk->pMem + 5 * nWords} };
    int i, iLit0, iLit1, nFans0, nFans1, nPairs;
    int fEquals[2][2], fOppos, fPairs[4][4];
    unsigned j, k, nFansNew, uSupp0, uSupp1;

    assert( pObj->nFans > 0 );
    assert( pObj->Type == KIT_DSD_PRIME );
    assert( uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans)) );

    // compress the truth table
    if ( uSupp != Kit_BitMask(pObj->nFans) )
    {
        nFansNew = Kit_WordCountOnes(uSupp);
        Kit_TruthShrink( pNtk->pMem, pTruth, nFansNew, pObj->nFans, uSupp, 1 );
        for ( j = k = 0; j < pObj->nFans; j++ )
            if ( uSupp & (1 << j) )
                pObj->pFans[k++] = pObj->pFans[j];
        assert( k == nFansNew );
        pObj->nFans = k;
        uSupp = Kit_BitMask(pObj->nFans);
    }

    // consider the single variable case
    if ( pObj->nFans == 1 )
    {
        pObj->Type = KIT_DSD_NONE;
        if ( pTruth[0] == 0x55555555 )
            pObj->pFans[0] = Abc_LitNot(pObj->pFans[0]);
        else
            assert( pTruth[0] == 0xAAAAAAAA );
        // update the parent pointer
        *pPar = Abc_LitNotCond( pObj->pFans[0], Abc_LitIsCompl(*pPar) );
        return;
    }

    // decompose the output
    if ( !pObj->fMark )
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        // get the two-variable cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
//        assert( !Kit_TruthVarInSupport( pCofs2[0], pObj->nFans, i) );
//        assert( !Kit_TruthVarInSupport( pCofs2[1], pObj->nFans, i) );
        // get the constant cofs
        fEquals[0][0] = Kit_TruthIsConst0( pCofs2[0], pObj->nFans );
        fEquals[0][1] = Kit_TruthIsConst0( pCofs2[1], pObj->nFans );
        fEquals[1][0] = Kit_TruthIsConst1( pCofs2[0], pObj->nFans );
        fEquals[1][1] = Kit_TruthIsConst1( pCofs2[1], pObj->nFans );
        fOppos        = Kit_TruthIsOpposite( pCofs2[0], pCofs2[1], pObj->nFans );
        assert( !Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans) );
        if ( fEquals[0][0] + fEquals[0][1] + fEquals[1][0] + fEquals[1][1] + fOppos == 0 )
        {
            // check the MUX decomposition
            uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
            uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
            assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
            if ( uSupp0 & uSupp1 )
                continue;
            // perform MUX decomposition
            pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            for ( k = 0; k < pObj->nFans; k++ )
            {
                pRes0->pFans[k] = (uSupp0 & (1 << k))? pObj->pFans[k] : 127;
                pRes1->pFans[k] = (uSupp1 & (1 << k))? pObj->pFans[k] : 127;
            }
            Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
            Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
            // update the current one
            assert( pObj->Type == KIT_DSD_PRIME );
            pTruth[0] = 0xCACACACA;
            pObj->nFans = 3;
            pObj->pFans[2] = pObj->pFans[i];
            pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
            pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
            // call recursively
            Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
            Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
            return;
        }

        // create the new node
        pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
        pRes->nRefs++;
        pRes->nFans = 2;
        pRes->pFans[0] = pObj->pFans[i];  pObj->pFans[i] = 127;  uSupp &= ~(1 << i);
        pRes->pFans[1] = 2*pObj->Id;
        // update the parent pointer
        *pPar = Abc_LitNotCond( 2 * pRes->Id, Abc_LitIsCompl(*pPar) );
        // consider different decompositions
        if ( fEquals[0][0] )
        {
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[0][1] )
        {
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fEquals[1][0] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[1][1] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fOppos )
        {
            pRes->Type = KIT_DSD_XOR;
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else
            assert( 0 );
        // decompose the remainder
        assert( Kit_DsdObjTruth(pObj) == pTruth );
        Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pRes->pFans + 1, nDecMux );
        return;
    }
    pObj->fMark = 1;

    // decompose the input
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        assert( Kit_TruthVarInSupport( pTruth, pObj->nFans, i ) );
        // get the single variale cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
        // check the existence of MUX decomposition
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
        // if one of the cofs is a constant, it is time to check the output again
        if ( uSupp0 == 0 || uSupp1 == 0 )
        {
            pObj->fMark = 0;
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
        assert( uSupp0 && uSupp1 );
        // get the number of unique variables
        nFans0 = Kit_WordCountOnes( uSupp0 & ~uSupp1 );
        nFans1 = Kit_WordCountOnes( uSupp1 & ~uSupp0 );
        if ( nFans0 == 1 && nFans1 == 1 )
        {
            // get the cofactors w.r.t. the unique variables
            iLit0 = Kit_WordFindFirstBit( uSupp0 & ~uSupp1 );
            iLit1 = Kit_WordFindFirstBit( uSupp1 & ~uSupp0 );
            // get four cofactors                                        
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, iLit1 );
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, iLit1 );
            // check existence conditions
            fEquals[0][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fEquals[0][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fEquals[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fEquals[1][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            if ( (fEquals[0][0] && fEquals[0][1]) || (fEquals[1][0] && fEquals[1][1]) )
            {
                // construct the MUX
                pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, 3 );
                Kit_DsdObjTruth(pRes)[0] = 0xCACACACA;
                pRes->nRefs++;
                pRes->nFans = 3;
                pRes->pFans[0] = pObj->pFans[iLit0]; pObj->pFans[iLit0] = 127;  uSupp &= ~(1 << iLit0);
                pRes->pFans[1] = pObj->pFans[iLit1]; pObj->pFans[iLit1] = 127;  uSupp &= ~(1 << iLit1);
                pRes->pFans[2] = pObj->pFans[i];     pObj->pFans[i] = 2 * pRes->Id; // remains in support
                // update the node
//                if ( fEquals[0][0] && fEquals[0][1] )
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, i );
//                else
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][1], pCofs4[0][0], pObj->nFans, i );
                Kit_TruthMuxVar( pTruth, pCofs4[1][0], pCofs4[1][1], pObj->nFans, i );
                if ( fEquals[1][0] && fEquals[1][1] )
                    pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
                // decompose the remainder
                Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
                return;
            }
        }

        // try other inputs
        for ( k = i+1; k < pObj->nFans; k++ )
        {
            // get four cofactors                                                ik
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, k ); // 00 
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, k ); // 01 
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, k ); // 10 
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, k ); // 11 
            // compare equal pairs
            fPairs[0][1] = fPairs[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[0][1], pObj->nFans );
            fPairs[0][2] = fPairs[2][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fPairs[0][3] = fPairs[3][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fPairs[1][2] = fPairs[2][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            fPairs[1][3] = fPairs[3][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fPairs[2][3] = fPairs[3][2] = Kit_TruthIsEqual( pCofs4[1][0], pCofs4[1][1], pObj->nFans );
            nPairs = fPairs[0][1] + fPairs[0][2] + fPairs[0][3] + fPairs[1][2] + fPairs[1][3] + fPairs[2][3];
            if ( nPairs != 3 && nPairs != 2 )
                continue;

            // decomposition exists
            pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
            pRes->nRefs++;
            pRes->nFans = 2;
            pRes->pFans[0] = pObj->pFans[k]; pObj->pFans[k] = 2 * pRes->Id;  // remains in support
            pRes->pFans[1] = pObj->pFans[i]; pObj->pFans[i] = 127;       uSupp &= ~(1 << i);
            if ( !fPairs[0][1] && !fPairs[0][2] && !fPairs[0][3] ) // 00
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
                Kit_TruthMuxVar( pTruth, pCofs4[1][1], pCofs4[0][0], pObj->nFans, k );
            }
            else if ( !fPairs[1][0] && !fPairs[1][2] && !fPairs[1][3] ) // 01
            {
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            else if ( !fPairs[2][0] && !fPairs[2][1] && !fPairs[2][3] ) // 10
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][0], pObj->nFans, k );
            }
            else if ( !fPairs[3][0] && !fPairs[3][1] && !fPairs[3][2] ) // 11
            {
//                unsigned uSupp0 = Kit_TruthSupport(pCofs4[0][0], pObj->nFans);
//                unsigned uSupp1 = Kit_TruthSupport(pCofs4[1][1], pObj->nFans);
//                unsigned uSupp;
//                Extra_PrintBinary( stdout, &uSupp0, pObj->nFans ); printf( "\n" );
//                Extra_PrintBinary( stdout, &uSupp1, pObj->nFans ); printf( "\n" );
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][1], pObj->nFans, k );
//                uSupp = Kit_TruthSupport(pTruth, pObj->nFans);
//                Extra_PrintBinary( stdout, &uSupp, pObj->nFans ); printf( "\n" ); printf( "\n" );
            }
            else
            {
                assert( fPairs[0][3] && fPairs[1][2] );
                pRes->Type = KIT_DSD_XOR;;
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            // decompose the remainder
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
    }

    // if all decomposition methods failed and we are still above the limit, perform MUX-decomposition
    if ( nDecMux > 0 && (int)pObj->nFans > nDecMux )
    {
        int iBestVar = Kit_TruthBestCofVar( pTruth, pObj->nFans, pCofs2[0], pCofs2[1] );
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        // perform MUX decomposition
        pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        for ( k = 0; k < pObj->nFans; k++ )
            pRes0->pFans[k] = pRes1->pFans[k] = pObj->pFans[k];
        Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
        Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
        // update the current one
        assert( pObj->Type == KIT_DSD_PRIME );
        pTruth[0] = 0xCACACACA;
        pObj->nFans = 3;
        pObj->pFans[2] = pObj->pFans[iBestVar];
        pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
        pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
        // call recursively
        Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
        Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
    }

}